

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q.cpp
# Opt level: O0

void __thiscall Q::create(Q *this,string *name,string *location)

{
  bool bVar1;
  undefined1 local_100 [8];
  Directory dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_78 [8];
  Directory base;
  string *location_local;
  string *name_local;
  Q *this_local;
  
  base.super_File._80_8_ = location;
  std::__cxx11::string::operator=((string *)this,(string *)name);
  std::__cxx11::string::operator=((string *)&this->_location,(string *)base.super_File._80_8_);
  Directory::Directory((Directory *)local_78,&this->_location);
  bVar1 = Path::exists((Path *)&base);
  if (!bVar1) {
    Directory::create((Directory *)local_78,0x1c0);
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&structure_abi_cxx11_);
  item = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&structure_abi_cxx11_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&item);
    if (!bVar1) break;
    dir.super_File._80_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    Directory::Directory((Directory *)local_100,(Directory *)local_78);
    Path::operator+=((Path *)&dir,(string *)dir.super_File._80_8_);
    bVar1 = Path::exists((Path *)&dir);
    if (!bVar1) {
      Directory::create((Directory *)local_100,0x1c0);
    }
    Directory::~Directory((Directory *)local_100);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Directory::~Directory((Directory *)local_78);
  return;
}

Assistant:

void Q::create (const std::string& name, const std::string& location)
{
  _name = name;
  _location = location;

  Directory base (_location);
  if (! base.exists ())
    base.create (0700);

  for (const auto& item : structure)
  {
    Directory dir {base};
    dir += item;
    if (! dir.exists ())
      dir.create (0700);
  }
}